

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall
Wasm::WasmBytecodeGenerator::SetUsesMemory(WasmBytecodeGenerator *this,uint32 memoryIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  WasmCompilationException *this_00;
  FunctionBody *this_01;
  AsmJsFunctionInfo *this_02;
  uint32 memoryIndex_local;
  WasmBytecodeGenerator *this_local;
  
  if (memoryIndex != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                       ,0x86d,"(memoryIndex == 0)","memoryIndex == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Js::WebAssemblyModule::HasMemory(this->m_module);
  if (!bVar2) {
    bVar2 = Js::WebAssemblyModule::HasMemoryImport(this->m_module);
    if (!bVar2) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException(this_00,L"unknown memory");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
  }
  this_01 = GetFunctionBody(this);
  this_02 = Js::FunctionBody::GetAsmJsFunctionInfo(this_01);
  Js::AsmJsFunctionInfo::SetUsesHeapBuffer(this_02,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::SetUsesMemory(uint32 memoryIndex)
{
    // Only support one memory at this time
    Assert(memoryIndex == 0);
    if (!m_module->HasMemory() && !m_module->HasMemoryImport())
    {
        throw WasmCompilationException(_u("unknown memory"));
    }
    GetFunctionBody()->GetAsmJsFunctionInfo()->SetUsesHeapBuffer(true);
}